

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O2

char * osc::FindStr4End(char *p,char *end)

{
  char *pcVar1;
  char *pcVar2;
  
  if (end <= p) {
    return (char *)0x0;
  }
  if (*p == '\0') {
    return p + 4;
  }
  pcVar1 = p + 3;
  do {
    pcVar2 = pcVar1;
    if (end + -1 <= pcVar2) break;
    pcVar1 = pcVar2 + 4;
  } while (*pcVar2 != '\0');
  pcVar1 = (char *)0x0;
  if (*pcVar2 == '\0') {
    pcVar1 = pcVar2 + 1;
  }
  return pcVar1;
}

Assistant:

static inline const char* FindStr4End( const char *p, const char *end )
{
    if( p >= end )
        return 0;

	if( p[0] == '\0' )    // special case for SuperCollider integer address pattern
		return p + 4;

    p += 3;
    end -= 1;

    while( p < end && *p )
        p += 4;

    if( *p )
        return 0;
    else
        return p + 1;
}